

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O2

string * __thiscall
gmlc::networking::TcpAcceptor::to_string_abi_cxx11_
          (string *__return_storage_ptr__,TcpAcceptor *this)

{
  ushort uVar1;
  bool bVar2;
  undefined1 local_30 [8];
  undefined1 local_28 [24];
  
  bVar2 = (this->endpoint_).impl_.data_.base.sa_family != 2;
  if (bVar2) {
    local_28._0_8_ = *(undefined8 *)((long)&(this->endpoint_).impl_.data_ + 8);
    local_28._8_8_ = *(size_type *)((long)&(this->endpoint_).impl_.data_ + 0x10);
    local_28._16_4_ = (this->endpoint_).impl_.data_.v6.sin6_scope_id;
    local_30._4_4_ = 0;
  }
  else {
    local_30._4_4_ = (this->endpoint_).impl_.data_.v4.sin_addr.s_addr;
    local_28._0_8_ = 0;
    local_28._8_8_ = 0;
    local_28._16_4_ = 0;
  }
  local_30._0_4_ = ZEXT14(bVar2);
  ::asio::ip::address::to_string_abi_cxx11_(__return_storage_ptr__,(address *)local_30);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,':');
  uVar1 = (this->endpoint_).impl_.data_.v4.sin_port;
  CLI::std::__cxx11::to_string((string *)local_30,(uint)(ushort)(uVar1 << 8 | uVar1 >> 8));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string TcpAcceptor::to_string() const
{
    auto str = endpoint_.address().to_string();
    str += ':';
    str += std::to_string(endpoint_.port());
    return str;
}